

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeUnbind(Vdbe *p,int i)

{
  uint uVar1;
  sqlite3_mutex *psVar2;
  Mem *pMVar3;
  undefined8 uVar4;
  char *zFormat;
  
  if (p == (Vdbe *)0x0) {
    zFormat = "API called with NULL prepared statement";
  }
  else {
    if (p->db != (sqlite3 *)0x0) {
      psVar2 = p->db->mutex;
      if (psVar2 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar2);
      }
      if ((p->magic == 0xbdf20da3) && (p->pc < 0)) {
        if ((0 < i) && (i <= p->nVar)) {
          uVar1 = i - 1;
          pMVar3 = p->aVar;
          sqlite3VdbeMemRelease(pMVar3 + uVar1);
          pMVar3[uVar1].flags = 1;
          sqlite3Error(p->db,0,(char *)0x0);
          if ((*(ushort *)&p->field_0x9a >> 9 & 1) == 0) {
            return 0;
          }
          if ((uint)i < 0x21) {
            if ((p->expmask >> (uVar1 & 0x1f) & 1) == 0) {
              return 0;
            }
          }
          else if (p->expmask != 0xffffffff) {
            return 0;
          }
          *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a | 0x20;
          return 0;
        }
        sqlite3Error(p->db,0x19,(char *)0x0);
        psVar2 = p->db->mutex;
        if (psVar2 == (sqlite3_mutex *)0x0) {
          return 0x19;
        }
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
        return 0x19;
      }
      sqlite3Error(p->db,0x15,(char *)0x0);
      psVar2 = p->db->mutex;
      if (psVar2 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar2);
      }
      sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
      uVar4 = 0xfabb;
      goto LAB_0014e670;
    }
    zFormat = "API called with finalized prepared statement";
  }
  sqlite3_log(0x15,zFormat);
  uVar4 = 0xfab3;
LAB_0014e670:
  sqlite3_log(0x15,"misuse at line %d of [%.10s]",uVar4,"118a3b35693b134d56ebd780123b7fd6f1497668");
  return 0x15;
}

Assistant:

static int vdbeUnbind(Vdbe *p, int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->magic!=VDBE_MAGIC_RUN || p->pc>=0 ){
    sqlite3Error(p->db, SQLITE_MISUSE, 0);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE, 
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i<1 || i>p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE, 0);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  i--;
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  sqlite3Error(p->db, SQLITE_OK, 0);

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then 
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-48440-37595 If the specific value bound to host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  if( p->isPrepareV2 &&
     ((i<32 && p->expmask & ((u32)1 << i)) || p->expmask==0xffffffff)
  ){
    p->expired = 1;
  }
  return SQLITE_OK;
}